

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O3

void non_existing_opendir_cb(uv_fs_t *req)

{
  char *__s1;
  int iVar1;
  undefined8 uVar2;
  uv_fs_t *puVar3;
  uv_fs_t *puVar4;
  long lVar5;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_958 [448];
  uv_fs_t *puStack_798;
  long lStack_788;
  long lStack_780;
  uv_fs_t *apuStack_778 [56];
  undefined8 auStack_5b8 [56];
  undefined8 auStack_3f8 [11];
  uv_fs_t *puStack_3a0;
  undefined1 auStack_238 [448];
  uv_fs_t *puStack_78;
  void *pvStack_28;
  
  if (req == &opendir_req) {
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_0018bc18;
    if (opendir_req.result != -2) goto LAB_0018bc27;
    if (opendir_req.ptr == (void *)0x0) {
      uv_fs_req_cleanup(&opendir_req);
      non_existing_opendir_cb_count = non_existing_opendir_cb_count + 1;
      return;
    }
  }
  else {
    non_existing_opendir_cb_cold_1();
LAB_0018bc18:
    non_existing_opendir_cb_cold_2();
LAB_0018bc27:
    non_existing_opendir_cb_cold_3();
  }
  non_existing_opendir_cb_cold_4();
  memset(&opendir_req,0xdb,0x1c0);
  uVar2 = uv_default_loop();
  iVar1 = uv_fs_opendir(uVar2,&opendir_req,"test/fixtures/empty_file",0);
  pvStack_28 = (void *)(long)iVar1;
  if (pvStack_28 == (void *)0xffffffffffffffec) {
    pvStack_28 = (void *)(long)opendir_req.fs_type;
    if (pvStack_28 != (void *)0x1f) goto LAB_0018be1a;
    pvStack_28 = (void *)opendir_req.result;
    if (opendir_req.result != -0x14) goto LAB_0018be27;
    if (opendir_req.ptr != (void *)0x0) goto LAB_0018be34;
    uv_fs_req_cleanup(&opendir_req);
    memset(&opendir_req,0xdb,0x1c0);
    uVar2 = uv_default_loop();
    iVar1 = uv_fs_opendir(uVar2,&opendir_req,"test/fixtures/empty_file",file_opendir_cb);
    pvStack_28 = (void *)(long)iVar1;
    if (pvStack_28 != (void *)0x0) goto LAB_0018be39;
    pvStack_28 = (void *)(long)file_opendir_cb_count;
    if (pvStack_28 != (void *)0x0) goto LAB_0018be46;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    pvStack_28 = (void *)(long)iVar1;
    if (pvStack_28 != (void *)0x0) goto LAB_0018be53;
    pvStack_28 = (void *)0x1;
    if (file_opendir_cb_count != 1) goto LAB_0018be60;
    puVar3 = (uv_fs_t *)uv_default_loop();
    uv_walk(puVar3,close_walk_cb,0);
    uv_run(puVar3,0);
    pvStack_28 = (void *)0x0;
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    if (pvStack_28 == (void *)(long)iVar1) {
      uv_library_shutdown();
      return;
    }
  }
  else {
    run_test_fs_readdir_file_cold_1();
LAB_0018be1a:
    run_test_fs_readdir_file_cold_2();
LAB_0018be27:
    run_test_fs_readdir_file_cold_3();
LAB_0018be34:
    run_test_fs_readdir_file_cold_4();
LAB_0018be39:
    run_test_fs_readdir_file_cold_5();
LAB_0018be46:
    run_test_fs_readdir_file_cold_6();
LAB_0018be53:
    run_test_fs_readdir_file_cold_7();
LAB_0018be60:
    puVar3 = &opendir_req;
    run_test_fs_readdir_file_cold_8();
  }
  puVar4 = (uv_fs_t *)&stack0xffffffffffffffd8;
  run_test_fs_readdir_file_cold_9();
  if (puVar4 == &opendir_req) {
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_0018bef4;
    if (opendir_req.result != -0x14) goto LAB_0018bf03;
    if (opendir_req.ptr == (void *)0x0) {
      uv_fs_req_cleanup(&opendir_req);
      file_opendir_cb_count = file_opendir_cb_count + 1;
      return;
    }
  }
  else {
    file_opendir_cb_cold_1();
LAB_0018bef4:
    file_opendir_cb_cold_2();
LAB_0018bf03:
    file_opendir_cb_cold_3();
  }
  file_opendir_cb_cold_4();
  puStack_798 = (uv_fs_t *)0x18bf2d;
  puStack_78 = puVar3;
  cleanup_test_files();
  puStack_798 = (uv_fs_t *)0x18bf32;
  uVar2 = uv_default_loop();
  puStack_798 = (uv_fs_t *)0x18bf51;
  iVar1 = uv_fs_mkdir(uVar2,auStack_238,"test_dir",0x1ed,0);
  apuStack_778[0] = (uv_fs_t *)(long)iVar1;
  auStack_3f8[0] = 0;
  if (apuStack_778[0] == (uv_fs_t *)0x0) {
    puStack_798 = (uv_fs_t *)0x18bf7c;
    uVar2 = uv_default_loop();
    puStack_798 = (uv_fs_t *)0x18bfa1;
    iVar1 = uv_fs_open(uVar2,auStack_3f8,"test_dir/file1",0x41,0x180,0);
    puVar4 = puStack_3a0;
    apuStack_778[0] = (uv_fs_t *)(long)iVar1;
    auStack_5b8[0] = 0;
    if (apuStack_778[0] != (uv_fs_t *)0x0) goto LAB_0018c588;
    apuStack_778[0] = puStack_3a0;
    auStack_5b8[0] = 0;
    if ((long)puStack_3a0 < 0) goto LAB_0018c59a;
    puStack_798 = (uv_fs_t *)0x18c000;
    uv_fs_req_cleanup(auStack_3f8);
    puStack_798 = (uv_fs_t *)0x18c005;
    uVar2 = uv_default_loop();
    puStack_798 = (uv_fs_t *)0x18c019;
    iVar1 = uv_fs_close(uVar2,auStack_5b8,(ulong)puVar4 & 0xffffffff,0);
    apuStack_778[0] = (uv_fs_t *)(long)iVar1;
    lStack_788 = 0;
    if (apuStack_778[0] != (uv_fs_t *)0x0) goto LAB_0018c5ac;
    puStack_798 = (uv_fs_t *)0x18c046;
    uv_fs_req_cleanup(auStack_5b8);
    puStack_798 = (uv_fs_t *)0x18c04b;
    uVar2 = uv_default_loop();
    puStack_798 = (uv_fs_t *)0x18c070;
    iVar1 = uv_fs_open(uVar2,auStack_3f8,"test_dir/file2",0x41,0x180,0);
    apuStack_778[0] = (uv_fs_t *)(long)iVar1;
    lStack_788 = 0;
    if (apuStack_778[0] != (uv_fs_t *)0x0) goto LAB_0018c5bb;
    apuStack_778[0] = puStack_3a0;
    lStack_788 = 0;
    puVar4 = puStack_3a0;
    if ((long)puStack_3a0 < 0) goto LAB_0018c5ca;
    puStack_798 = (uv_fs_t *)0x18c0c3;
    uv_fs_req_cleanup(auStack_3f8);
    puStack_798 = (uv_fs_t *)0x18c0c8;
    uVar2 = uv_default_loop();
    puStack_798 = (uv_fs_t *)0x18c0dc;
    iVar1 = uv_fs_close(uVar2,auStack_5b8,(ulong)puStack_3a0 & 0xffffffff,0);
    apuStack_778[0] = (uv_fs_t *)(long)iVar1;
    lStack_788 = 0;
    if (apuStack_778[0] != (uv_fs_t *)0x0) goto LAB_0018c5d9;
    puStack_798 = (uv_fs_t *)0x18c109;
    uv_fs_req_cleanup(auStack_5b8);
    puStack_798 = (uv_fs_t *)0x18c10e;
    uVar2 = uv_default_loop();
    puStack_798 = (uv_fs_t *)0x18c12d;
    iVar1 = uv_fs_mkdir(uVar2,auStack_238,"test_dir/test_subdir",0x1ed,0);
    apuStack_778[0] = (uv_fs_t *)(long)iVar1;
    lStack_788 = 0;
    if (apuStack_778[0] != (uv_fs_t *)0x0) goto LAB_0018c5e8;
    puStack_798 = (uv_fs_t *)0x18c15a;
    uv_fs_req_cleanup(auStack_238);
    puVar4 = &opendir_req;
    puStack_798 = (uv_fs_t *)0x18c173;
    memset(&opendir_req,0xdb,0x1c0);
    puStack_798 = (uv_fs_t *)0x18c178;
    uVar2 = uv_default_loop();
    puStack_798 = (uv_fs_t *)0x18c18c;
    iVar1 = uv_fs_opendir(uVar2,&opendir_req,"test_dir",0);
    puVar3 = (uv_fs_t *)opendir_req.ptr;
    apuStack_778[0] = (uv_fs_t *)(long)iVar1;
    lStack_788 = 0;
    if (apuStack_778[0] != (uv_fs_t *)0x0) goto LAB_0018c5f7;
    apuStack_778[0] = (uv_fs_t *)(long)opendir_req.fs_type;
    lStack_788 = 0x1f;
    if (apuStack_778[0] != (uv_fs_t *)0x1f) goto LAB_0018c606;
    apuStack_778[0] = (uv_fs_t *)opendir_req.result;
    lStack_788 = 0;
    if (opendir_req.result != 0) goto LAB_0018c615;
    if (opendir_req.ptr == (void *)0x0) goto LAB_0018c624;
    *(uv_dirent_t **)opendir_req.ptr = dirents;
    *(undefined8 *)((long)puVar3 + 8) = 1;
    puStack_798 = (uv_fs_t *)0x18c224;
    uv_fs_req_cleanup(&opendir_req);
    puStack_798 = (uv_fs_t *)0x18c229;
    uVar2 = uv_default_loop();
    lVar5 = 0;
    puStack_798 = (uv_fs_t *)0x18c240;
    iVar1 = uv_fs_readdir(uVar2,&readdir_req,puVar3,0);
    if (iVar1 != 0) {
      lVar5 = 0;
      do {
        __s1 = dirents[0].name;
        puStack_798 = (uv_fs_t *)0x18c272;
        iVar1 = strcmp(dirents[0].name,"file1");
        if (iVar1 != 0) {
          puStack_798 = (uv_fs_t *)0x18c285;
          iVar1 = strcmp(__s1,"file2");
          if (iVar1 == 0) goto LAB_0018c29c;
          puStack_798 = (uv_fs_t *)0x18c294;
          iVar1 = strcmp(__s1,"test_subdir");
          if (iVar1 == 0) goto LAB_0018c29c;
LAB_0018c562:
          puStack_798 = (uv_fs_t *)0x18c567;
          run_test_fs_readdir_non_empty_dir_cold_10();
LAB_0018c567:
          puStack_798 = (uv_fs_t *)0x18c576;
          run_test_fs_readdir_non_empty_dir_cold_12();
          goto LAB_0018c576;
        }
LAB_0018c29c:
        puStack_798 = (uv_fs_t *)0x18c2a7;
        iVar1 = strcmp(__s1,"test_subdir");
        if (iVar1 == 0) {
          apuStack_778[0] = (uv_fs_t *)(ulong)dirents[0].type;
          lStack_788 = 2;
          if (apuStack_778[0] == (uv_fs_t *)0x2) goto LAB_0018c2f4;
          goto LAB_0018c567;
        }
        apuStack_778[0] = (uv_fs_t *)(ulong)dirents[0].type;
        lStack_788 = 1;
        if (apuStack_778[0] != (uv_fs_t *)0x1) {
          puStack_798 = (uv_fs_t *)0x18c562;
          run_test_fs_readdir_non_empty_dir_cold_11();
          goto LAB_0018c562;
        }
LAB_0018c2f4:
        apuStack_778[0] = (uv_fs_t *)(ulong)dirents[0].type;
        puStack_798 = (uv_fs_t *)0x18c2fc;
        uv_fs_req_cleanup(&readdir_req);
        lVar5 = lVar5 + 1;
        puStack_798 = (uv_fs_t *)0x18c304;
        uVar2 = uv_default_loop();
        puStack_798 = (uv_fs_t *)0x18c314;
        iVar1 = uv_fs_readdir(uVar2,&readdir_req,puVar3,0);
      } while (iVar1 != 0);
    }
    apuStack_778[0] = (uv_fs_t *)0x3;
    lStack_788 = lVar5;
    if (lVar5 != 3) goto LAB_0018c629;
    puStack_798 = (uv_fs_t *)0x18c346;
    uv_fs_req_cleanup(&readdir_req);
    puStack_798 = (uv_fs_t *)0x18c35f;
    memset(&closedir_req,0xdb,0x1c0);
    puStack_798 = (uv_fs_t *)0x18c364;
    uVar2 = uv_default_loop();
    puStack_798 = (uv_fs_t *)0x18c374;
    uv_fs_closedir(uVar2,&closedir_req,puVar3,0);
    apuStack_778[0] = (uv_fs_t *)closedir_req.result;
    lStack_788 = 0;
    if (closedir_req.result != 0) goto LAB_0018c638;
    puStack_798 = (uv_fs_t *)0x18c3a5;
    uv_fs_req_cleanup(&closedir_req);
    puVar3 = &opendir_req;
    puStack_798 = (uv_fs_t *)0x18c3be;
    memset(&opendir_req,0xdb,0x1c0);
    puStack_798 = (uv_fs_t *)0x18c3c3;
    uVar2 = uv_default_loop();
    puStack_798 = (uv_fs_t *)0x18c3dc;
    iVar1 = uv_fs_opendir(uVar2,&opendir_req,"test_dir",non_empty_opendir_cb);
    apuStack_778[0] = (uv_fs_t *)(long)iVar1;
    lStack_788 = 0;
    if (apuStack_778[0] != (uv_fs_t *)0x0) goto LAB_0018c647;
    apuStack_778[0] = (uv_fs_t *)(long)non_empty_opendir_cb_count;
    lStack_788 = 0;
    if (apuStack_778[0] != (uv_fs_t *)0x0) goto LAB_0018c656;
    apuStack_778[0] = (uv_fs_t *)(long)non_empty_closedir_cb_count;
    lStack_788 = 0;
    if (apuStack_778[0] != (uv_fs_t *)0x0) goto LAB_0018c665;
    puStack_798 = (uv_fs_t *)0x18c44b;
    uVar2 = uv_default_loop();
    puStack_798 = (uv_fs_t *)0x18c455;
    iVar1 = uv_run(uVar2,0);
    apuStack_778[0] = (uv_fs_t *)(long)iVar1;
    lStack_788 = 0;
    if (apuStack_778[0] != (uv_fs_t *)0x0) goto LAB_0018c674;
    apuStack_778[0] = (uv_fs_t *)0x1;
    lStack_788 = (long)non_empty_opendir_cb_count;
    if (lStack_788 != 1) goto LAB_0018c683;
    apuStack_778[0] = (uv_fs_t *)0x1;
    lStack_788 = (long)non_empty_closedir_cb_count;
    if (lStack_788 == 1) {
      puStack_798 = (uv_fs_t *)0x18c4c4;
      uVar2 = uv_default_loop();
      puStack_798 = (uv_fs_t *)0x18c4dd;
      uv_fs_rmdir(uVar2,apuStack_778,"test_subdir",0);
      puStack_798 = (uv_fs_t *)0x18c4e5;
      uv_fs_req_cleanup(apuStack_778);
      puStack_798 = (uv_fs_t *)0x18c4ea;
      cleanup_test_files();
      puStack_798 = (uv_fs_t *)0x18c4ef;
      puVar3 = (uv_fs_t *)uv_default_loop();
      puStack_798 = (uv_fs_t *)0x18c503;
      uv_walk(puVar3,close_walk_cb,0);
      puStack_798 = (uv_fs_t *)0x18c50d;
      uv_run(puVar3,0);
      lStack_788 = 0;
      puStack_798 = (uv_fs_t *)0x18c51b;
      uVar2 = uv_default_loop();
      puStack_798 = (uv_fs_t *)0x18c523;
      iVar1 = uv_loop_close(uVar2);
      lStack_780 = (long)iVar1;
      if (lStack_788 == lStack_780) {
        puStack_798 = (uv_fs_t *)0x18c53f;
        uv_library_shutdown();
        return;
      }
      goto LAB_0018c6a1;
    }
  }
  else {
LAB_0018c576:
    puStack_798 = (uv_fs_t *)0x18c588;
    run_test_fs_readdir_non_empty_dir_cold_1();
LAB_0018c588:
    puVar4 = puVar3;
    puStack_798 = (uv_fs_t *)0x18c59a;
    run_test_fs_readdir_non_empty_dir_cold_2();
LAB_0018c59a:
    puStack_798 = (uv_fs_t *)0x18c5ac;
    run_test_fs_readdir_non_empty_dir_cold_24();
LAB_0018c5ac:
    puStack_798 = (uv_fs_t *)0x18c5bb;
    run_test_fs_readdir_non_empty_dir_cold_3();
LAB_0018c5bb:
    puStack_798 = (uv_fs_t *)0x18c5ca;
    run_test_fs_readdir_non_empty_dir_cold_4();
LAB_0018c5ca:
    puStack_798 = (uv_fs_t *)0x18c5d9;
    run_test_fs_readdir_non_empty_dir_cold_23();
LAB_0018c5d9:
    puStack_798 = (uv_fs_t *)0x18c5e8;
    run_test_fs_readdir_non_empty_dir_cold_5();
LAB_0018c5e8:
    puStack_798 = (uv_fs_t *)0x18c5f7;
    run_test_fs_readdir_non_empty_dir_cold_6();
LAB_0018c5f7:
    puStack_798 = (uv_fs_t *)0x18c606;
    run_test_fs_readdir_non_empty_dir_cold_7();
LAB_0018c606:
    puStack_798 = (uv_fs_t *)0x18c615;
    run_test_fs_readdir_non_empty_dir_cold_8();
LAB_0018c615:
    puVar3 = puVar4;
    puStack_798 = (uv_fs_t *)0x18c624;
    run_test_fs_readdir_non_empty_dir_cold_9();
LAB_0018c624:
    puStack_798 = (uv_fs_t *)0x18c629;
    run_test_fs_readdir_non_empty_dir_cold_22();
LAB_0018c629:
    puStack_798 = (uv_fs_t *)0x18c638;
    run_test_fs_readdir_non_empty_dir_cold_13();
LAB_0018c638:
    puStack_798 = (uv_fs_t *)0x18c647;
    run_test_fs_readdir_non_empty_dir_cold_14();
LAB_0018c647:
    puStack_798 = (uv_fs_t *)0x18c656;
    run_test_fs_readdir_non_empty_dir_cold_15();
LAB_0018c656:
    puStack_798 = (uv_fs_t *)0x18c665;
    run_test_fs_readdir_non_empty_dir_cold_16();
LAB_0018c665:
    puStack_798 = (uv_fs_t *)0x18c674;
    run_test_fs_readdir_non_empty_dir_cold_17();
LAB_0018c674:
    puStack_798 = (uv_fs_t *)0x18c683;
    run_test_fs_readdir_non_empty_dir_cold_18();
LAB_0018c683:
    puStack_798 = (uv_fs_t *)0x18c692;
    run_test_fs_readdir_non_empty_dir_cold_19();
  }
  puStack_798 = (uv_fs_t *)0x18c6a1;
  run_test_fs_readdir_non_empty_dir_cold_20();
LAB_0018c6a1:
  puStack_798 = (uv_fs_t *)cleanup_test_files;
  run_test_fs_readdir_non_empty_dir_cold_21();
  puStack_798 = puVar3;
  uv_fs_unlink(0,auStack_958,"test_dir/file1",0);
  uv_fs_req_cleanup(auStack_958);
  uv_fs_unlink(0,auStack_958,"test_dir/file2",0);
  uv_fs_req_cleanup(auStack_958);
  uv_fs_rmdir(0,auStack_958,"test_dir/test_subdir",0);
  uv_fs_req_cleanup(auStack_958);
  uv_fs_rmdir(0,auStack_958,"test_dir",0);
  uv_fs_req_cleanup(auStack_958);
  return;
}

Assistant:

static void non_existing_opendir_cb(uv_fs_t* req) {
  ASSERT_PTR_EQ(req, &opendir_req);
  ASSERT_EQ(req->fs_type, UV_FS_OPENDIR);
  ASSERT_EQ(req->result, UV_ENOENT);
  ASSERT_NULL(req->ptr);

  uv_fs_req_cleanup(req);
  ++non_existing_opendir_cb_count;
}